

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O0

rcode __thiscall
olc::ImageLoader_LibPNG::LoadImageResource
          (ImageLoader_LibPNG *this,Sprite *spr,string *sImageFile,ResourcePack *pack)

{
  int iVar1;
  __jmp_buf_tag *__env;
  char *__filename;
  undefined1 local_1d0 [8];
  istream is;
  undefined1 local_b8 [8];
  ResourceBuffer rb;
  FILE *f;
  anon_class_24_3_b3917af9 loadPNG;
  png_infop info;
  png_structp png;
  ResourcePack *pack_local;
  string *sImageFile_local;
  Sprite *spr_local;
  ImageLoader_LibPNG *this_local;
  
  png = (png_structp)pack;
  pack_local = (ResourcePack *)sImageFile;
  sImageFile_local = (string *)spr;
  spr_local = (Sprite *)this;
  if ((spr->pColData != (Pixel *)0x0) && (spr->pColData != (Pixel *)0x0)) {
    operator_delete__(spr->pColData);
  }
  f = (FILE *)&info;
  loadPNG.png = (png_structp *)&loadPNG.spr;
  loadPNG.info = (png_infop *)&sImageFile_local;
  info = (png_infop)png_create_read_struct("1.6.37",0,0);
  if ((info != (png_infop)0x0) &&
     (loadPNG.spr = (Sprite **)png_create_info_struct(info), loadPNG.spr != (Sprite **)0x0)) {
    __env = (__jmp_buf_tag *)png_set_longjmp_fn(info,longjmp,200);
    iVar1 = _setjmp(__env);
    if (iVar1 == 0) {
      if (png == (png_structp)0x0) {
        __filename = (char *)std::__cxx11::string::c_str();
        rb.vMemory.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ =
             fopen(__filename,"rb");
        if ((FILE *)rb.vMemory.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ ==
            (FILE *)0x0) {
          return NO_FILE;
        }
        png_init_io(info,rb.vMemory.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_);
        LoadImageResource::anon_class_24_3_b3917af9::operator()((anon_class_24_3_b3917af9 *)&f);
        fclose((FILE *)rb.vMemory.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_);
      }
      else {
        ResourcePack::GetFileBuffer
                  ((ResourceBuffer *)local_b8,(ResourcePack *)png,(string *)pack_local);
        std::istream::istream(local_1d0,(streambuf *)local_b8);
        png_set_read_fn(info,local_1d0,pngReadStream);
        LoadImageResource::anon_class_24_3_b3917af9::operator()((anon_class_24_3_b3917af9 *)&f);
        std::istream::~istream(local_1d0);
        ResourceBuffer::~ResourceBuffer((ResourceBuffer *)local_b8);
      }
      return OK;
    }
  }
  *(undefined4 *)sImageFile_local = 0;
  *(undefined4 *)&sImageFile_local->field_0x4 = 0;
  sImageFile_local->_M_string_length = 0;
  return FAIL;
}

Assistant:

olc::rcode LoadImageResource(olc::Sprite *spr, const std::string &sImageFile, olc::ResourcePack *pack) override
		{
			UNUSED(pack);

			// clear out existing sprite
			if (spr->pColData != nullptr)
				delete[] spr->pColData;

			////////////////////////////////////////////////////////////////////////////
			// Use libpng, Thanks to Guillaume Cottenceau
			// https://gist.github.com/niw/5963798
			// Also reading png from streams
			// http://www.piko3d.net/tutorials/libpng-tutorial-loading-png-files-from-streams/
			png_structp png;
			png_infop info;

			auto loadPNG = [&]() {
				png_read_info(png, info);
				png_byte color_type;
				png_byte bit_depth;
				png_bytep *row_pointers;
				spr->width = png_get_image_width(png, info);
				spr->height = png_get_image_height(png, info);
				color_type = png_get_color_type(png, info);
				bit_depth = png_get_bit_depth(png, info);
				if (bit_depth == 16)
					png_set_strip_16(png);
				if (color_type == PNG_COLOR_TYPE_PALETTE)
					png_set_palette_to_rgb(png);
				if (color_type == PNG_COLOR_TYPE_GRAY && bit_depth < 8)
					png_set_expand_gray_1_2_4_to_8(png);
				if (png_get_valid(png, info, PNG_INFO_tRNS))
					png_set_tRNS_to_alpha(png);
				if (color_type == PNG_COLOR_TYPE_RGB || color_type == PNG_COLOR_TYPE_GRAY || color_type == PNG_COLOR_TYPE_PALETTE)
					png_set_filler(png, 0xFF, PNG_FILLER_AFTER);
				if (color_type == PNG_COLOR_TYPE_GRAY || color_type == PNG_COLOR_TYPE_GRAY_ALPHA)
					png_set_gray_to_rgb(png);
				png_read_update_info(png, info);
				row_pointers = (png_bytep *)malloc(sizeof(png_bytep) * spr->height);
				for (int y = 0; y < spr->height; y++)
				{
					row_pointers[y] = (png_byte *)malloc(png_get_rowbytes(png, info));
				}
				png_read_image(png, row_pointers);
				////////////////////////////////////////////////////////////////////////////
				// Create sprite array
				spr->pColData = new Pixel[spr->width * spr->height];
				// Iterate through image rows, converting into sprite format
				for (int y = 0; y < spr->height; y++)
				{
					png_bytep row = row_pointers[y];
					for (int x = 0; x < spr->width; x++)
					{
						png_bytep px = &(row[x * 4]);
						spr->SetPixel(x, y, Pixel(px[0], px[1], px[2], px[3]));
					}
				}

				for (int y = 0; y < spr->height; y++) // Thanks maksym33
					free(row_pointers[y]);
				free(row_pointers);
				png_destroy_read_struct(&png, &info, nullptr);
			};

			png = png_create_read_struct(PNG_LIBPNG_VER_STRING, NULL, NULL, NULL);
			if (!png)
				goto fail_load;

			info = png_create_info_struct(png);
			if (!info)
				goto fail_load;

			if (setjmp(png_jmpbuf(png)))
				goto fail_load;

			if (pack == nullptr)
			{
				FILE *f = fopen(sImageFile.c_str(), "rb");
				if (!f)
					return olc::rcode::NO_FILE;
				png_init_io(png, f);
				loadPNG();
				fclose(f);
			}
			else
			{
				ResourceBuffer rb = pack->GetFileBuffer(sImageFile);
				std::istream is(&rb);
				png_set_read_fn(png, (png_voidp)&is, pngReadStream);
				loadPNG();
			}

			return olc::rcode::OK;

		fail_load:
			spr->width = 0;
			spr->height = 0;
			spr->pColData = nullptr;
			return olc::rcode::FAIL;
		}